

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O1

If_Obj_t * If_ManCreateAnd(If_Man_t *p,If_Obj_t *pFan0,If_Obj_t *pFan1)

{
  If_Obj_t *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  If_Obj_t *pIVar5;
  If_Obj_t *pIVar6;
  
  if (pFan0 != pFan1) {
    if ((If_Obj_t *)((ulong)pFan1 ^ 1) == pFan0) {
      pFan0 = (If_Obj_t *)((ulong)p->pConst1 ^ 1);
    }
    else {
      pIVar5 = (If_Obj_t *)((ulong)pFan0 & 0xfffffffffffffffe);
      pIVar1 = p->pConst1;
      if (pIVar1 == pIVar5) {
        if (pIVar1 == pFan0) {
          return pFan1;
        }
      }
      else {
        pIVar6 = (If_Obj_t *)((ulong)pFan1 & 0xfffffffffffffffe);
        if (pIVar1 != pIVar6) {
          pIVar1 = If_ManSetupObj(p);
          *(uint *)pIVar1 =
               (*(uint *)pIVar1 & 0xffffffc0) + (((uint)pFan1 & 1) << 5 | ((uint)pFan0 & 1) << 4) +
               4;
          pIVar1->pFanin0 = pIVar5;
          pIVar5->nRefs = pIVar5->nRefs + 1;
          pIVar5->nVisits = pIVar5->nVisits + 1;
          pIVar5->nVisitsCopy = pIVar5->nVisitsCopy + 1;
          pIVar1->pFanin1 = pIVar6;
          pIVar6->nRefs = pIVar6->nRefs + 1;
          pIVar6->nVisits = pIVar6->nVisits + 1;
          pIVar6->nVisitsCopy = pIVar6->nVisitsCopy + 1;
          uVar2 = *(uint *)pIVar1;
          uVar4 = ((*(uint *)pIVar6 >> 6 ^ uVar2 >> 5) & (*(uint *)pIVar5 >> 6 ^ uVar2 >> 4) & 1) <<
                  6;
          *(uint *)pIVar1 = uVar2 & 0xffffffbf | uVar4;
          uVar3 = *(uint *)pIVar6 >> 0xd;
          if (*(uint *)pIVar6 >> 0xd < *(uint *)pIVar5 >> 0xd) {
            uVar3 = *(uint *)pIVar5 >> 0xd;
          }
          *(uint *)pIVar1 = (uVar2 & 0x1fbf | uVar4) + uVar3 * 0x2000 + 0x2000;
          uVar2 = uVar3 * 0x2000 + 0x2000 >> 0xd;
          if (p->nLevelMax < (int)uVar2) {
            p->nLevelMax = uVar2;
          }
          p->nObjs[4] = p->nObjs[4] + 1;
          return pIVar1;
        }
        if (pIVar1 == pFan1) {
          return pFan0;
        }
      }
      pFan0 = (If_Obj_t *)((ulong)pIVar1 ^ 1);
    }
  }
  return pFan0;
}

Assistant:

If_Obj_t * If_ManCreateAnd( If_Man_t * p, If_Obj_t * pFan0, If_Obj_t * pFan1 )
{
    If_Obj_t * pObj;
    // perform constant propagation
    if ( pFan0 == pFan1 )
        return pFan0;
    if ( pFan0 == If_Not(pFan1) )
        return If_Not(p->pConst1);
    if ( If_Regular(pFan0) == p->pConst1 )
        return pFan0 == p->pConst1 ? pFan1 : If_Not(p->pConst1);
    if ( If_Regular(pFan1) == p->pConst1 )
        return pFan1 == p->pConst1 ? pFan0 : If_Not(p->pConst1);
    // get memory for the new object
    pObj = If_ManSetupObj( p );
    pObj->Type    = IF_AND;
    pObj->fCompl0 = If_IsComplement(pFan0); pFan0 = If_Regular(pFan0);
    pObj->fCompl1 = If_IsComplement(pFan1); pFan1 = If_Regular(pFan1);
    pObj->pFanin0 = pFan0; pFan0->nRefs++; pFan0->nVisits++; pFan0->nVisitsCopy++;
    pObj->pFanin1 = pFan1; pFan1->nRefs++; pFan1->nVisits++; pFan1->nVisitsCopy++;
    pObj->fPhase  = (pObj->fCompl0 ^ pFan0->fPhase) & (pObj->fCompl1 ^ pFan1->fPhase);
    pObj->Level   = 1 + IF_MAX( pFan0->Level, pFan1->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nObjs[IF_AND]++;
    return pObj;
}